

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module)

{
  _Rb_tree_node_base *__k;
  _Base_ptr *calls;
  __node_base_ptr *this_00;
  Index x;
  pointer puVar1;
  pointer puVar2;
  Export *pEVar3;
  mapped_type ppEVar4;
  _Head_base<0UL,_wasm::Function_*,_false> _Var5;
  __buckets_ptr pp_Var6;
  __node_base _Var7;
  pointer pCVar8;
  bool bVar9;
  mapped_type *pmVar10;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *pvVar11;
  mapped_type *pppEVar12;
  Function *func_00;
  _Base_ptr p_Var13;
  size_t sVar14;
  size_type sVar15;
  iterator iVar16;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_> _Var17
  ;
  uint uVar18;
  long *plVar19;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> _Var20;
  pointer puVar21;
  __buckets_ptr pp_Var22;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar23;
  long *plVar24;
  undefined8 *puVar25;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  Signature SVar26;
  undefined1 local_3d0 [8];
  DAEScanner scanner;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  changed;
  void *local_1d0;
  long local_1c0;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a8;
  undefined1 local_170 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  long local_128;
  undefined1 local_120 [8];
  DAEFunctionInfoMap infoMap;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_a8;
  Function *local_90;
  Function *func_1;
  SortedVector removedIndexes;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_68;
  allocator_type local_49;
  pointer local_48;
  DAE *local_40;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> local_38;
  
  local_48 = (pointer)&this->allDroppedCalls;
  local_40 = this;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_48);
  local_120 = (undefined1  [8])&infoMap._M_h._M_rehash_policy._M_next_resize;
  infoMap._M_h._M_buckets = (__buckets_ptr)0x1;
  infoMap._M_h._M_bucket_count = 0;
  infoMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  infoMap._M_h._M_element_count._0_4_ = 0x3f800000;
  infoMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  infoMap._M_h._M_rehash_policy._4_4_ = 0;
  infoMap._M_h._M_rehash_policy._M_next_resize = 0;
  puVar21 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar1) {
    do {
      std::__detail::
      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)local_120,
                   (key_type *)
                   (puVar21->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar1);
  }
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name.field_2._8_8_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_3d0 = (undefined1  [8])&PTR__WalkerPass_00d88030;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currModule =
       (Module *)local_120;
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.name.field_2 + 8),module);
  puVar23 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_head_impl = (DylinkSection *)module;
  if (puVar23 != puVar2) {
    do {
      pEVar3 = (puVar23->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar3->kind == Function) {
        pmVar10 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_120,&pEVar3->value);
        LOCK();
        (pmVar10->hasUnseenCalls)._M_base._M_i = true;
        UNLOCK();
      }
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar2);
  }
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)local_3d0,(local_40->super_Pass).runner,(Module *)local_38._M_head_impl);
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&allCalls;
  allCalls._M_t._M_impl._0_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_170 = (undefined1  [8])&tailCallees._M_h._M_rehash_policy._M_next_resize;
  tailCallees._M_h._M_buckets = (__buckets_ptr)0x1;
  tailCallees._M_h._M_bucket_count = 0;
  tailCallees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tailCallees._M_h._M_element_count._0_4_ = 0x3f800000;
  tailCallees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tailCallees._M_h._M_rehash_policy._4_4_ = 0;
  tailCallees._M_h._M_rehash_policy._M_next_resize = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (infoMap._M_h._M_bucket_count != 0) {
    plVar19 = (long *)infoMap._M_h._M_bucket_count;
    do {
      plVar24 = plVar19 + 8;
      while (plVar24 = (long *)*plVar24, plVar24 != (long *)0x0) {
        pvVar11 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                  std::
                  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                                *)&infoMap._M_h._M_single_bucket,(key_type *)(plVar24 + 1));
        std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>>
                  (pvVar11,*(undefined8 *)(pvVar11 + 8),plVar24[3],plVar24[4]);
      }
      for (puVar25 = (undefined8 *)plVar19[0x17]; puVar25 != (undefined8 *)0x0;
          puVar25 = (undefined8 *)*puVar25) {
        scanner._280_8_ =
             (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_170;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_170,puVar25 + 1,&scanner.numParams);
      }
      for (puVar25 = (undefined8 *)plVar19[0xf]; puVar25 != (undefined8 *)0x0;
          puVar25 = (undefined8 *)*puVar25) {
        ppEVar4 = (mapped_type)puVar25[2];
        pppEVar12 = std::__detail::
                    _Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_48,(key_type *)(puVar25 + 1));
        *pppEVar12 = ppEVar4;
      }
      plVar19 = (long *)*plVar19;
    } while (plVar19 != (long *)0x0);
  }
  _Var20 = local_38;
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)&allCalls) {
    uVar18 = 0;
  }
  else {
    local_48 = (pointer)((ulong)local_48 & 0xffffffff00000000);
    p_Var13 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      __k = p_Var13 + 1;
      pmVar10 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_120,(key_type *)__k);
      if (((pmVar10->hasUnseenCalls)._M_base._M_i & 1U) == 0) {
        func_00 = Module::getFunction((Module *)_Var20._M_head_impl,
                                      (Name)*(string_view *)(p_Var13 + 1));
        pmVar10 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_120,(key_type *)__k);
        calls = &p_Var13[1]._M_left;
        refineArgumentTypes(local_40,func_00,
                            (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                            (Module *)_Var20._M_head_impl,pmVar10);
        bVar9 = refineReturnTypes(local_40,func_00,
                                  (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                                  (Module *)_Var20._M_head_impl);
        uVar18 = (uint)local_48 & 0xff;
        if (bVar9) {
          uVar18 = 1;
        }
        local_48 = (pointer)CONCAT44(local_48._4_4_,uVar18);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_a8;
        local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)func_00;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&func_1,__l,
                   (allocator_type *)&local_90);
        local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParamUtils::applyConstantValues
                  ((SortedVector *)&scanner.numParams,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&func_1,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,&local_68,
                   (Module *)_Var20._M_head_impl);
        if (local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pp_Var22 = (__buckets_ptr)scanner._280_8_;
        pp_Var6 = changed._M_h._M_buckets;
        if (func_1 != (Function *)0x0) {
          operator_delete(func_1,(long)removedIndexes.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)func_1);
          pp_Var22 = (__buckets_ptr)scanner._280_8_;
          pp_Var6 = changed._M_h._M_buckets;
        }
        for (; _Var20._M_head_impl = local_38._M_head_impl, pp_Var22 != pp_Var6;
            pp_Var22 = (__buckets_ptr)((long)pp_Var22 + 4)) {
          x = *(Index *)pp_Var22;
          pmVar10 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_120,(key_type *)__k);
          SortedVector::insert(&pmVar10->unusedParams,x);
        }
        if (scanner._280_8_ != 0) {
          operator_delete((void *)scanner._280_8_,changed._M_h._M_bucket_count - scanner._280_8_);
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)&allCalls);
    uVar18 = (uint)local_48;
  }
  if ((uVar18 & 1) != 0) {
    ReFinalize::ReFinalize((ReFinalize *)&scanner.numParams);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&scanner.numParams,(local_40->super_Pass).runner,(Module *)_Var20._M_head_impl);
    scanner._280_8_ = &PTR__ReFinalize_00d870a0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1a8);
    if (local_1d0 != (void *)0x0) {
      operator_delete(local_1d0,local_1c0 - (long)local_1d0);
    }
    scanner._280_8_ = &PTR__Pass_00d87048;
    if ((size_type *)changed._M_h._M_bucket_count != &changed._M_h._M_element_count) {
      operator_delete((void *)changed._M_h._M_bucket_count,
                      CONCAT44(changed._M_h._M_element_count._4_4_,
                               (undefined4)changed._M_h._M_element_count) + 1);
    }
  }
  local_48 = (pointer)CONCAT44(local_48._4_4_,uVar18);
  scanner._280_8_ = &changed._M_h._M_rehash_policy._M_next_resize;
  changed._M_h._M_buckets = (__buckets_ptr)0x1;
  changed._M_h._M_bucket_count = 0;
  changed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  changed._M_h._M_element_count._0_4_ = 0x3f800000;
  changed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  changed._M_h._M_rehash_policy._4_4_ = 0;
  changed._M_h._M_rehash_policy._M_next_resize = 0;
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&allCalls) {
    this_00 = &tailCallees._M_h._M_single_bucket;
    p_Var13 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      pmVar10 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_120,(key_type *)(p_Var13 + 1));
      if (((pmVar10->hasUnseenCalls)._M_base._M_i & 1U) == 0) {
        local_90 = Module::getFunction((Module *)local_38._M_head_impl,
                                       (Name)*(string_view *)(p_Var13 + 1));
        sVar14 = Function::getNumParams(local_90);
        if (sVar14 != 0) {
          allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_90;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_68,__l_00
                     ,&local_49);
          pmVar10 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_120,(key_type *)(p_Var13 + 1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pmVar10);
          local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParamUtils::removeParameters
                    ((SortedVector *)&func_1,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_68,
                     (SortedVector *)this_00,
                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&p_Var13[1]._M_left,
                     &local_a8,(Module *)local_38._M_head_impl,(local_40->super_Pass).runner);
          if ((Function *)
              local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start != (Function *)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tailCallees._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            operator_delete(tailCallees._M_h._M_single_bucket,
                            local_128 - (long)tailCallees._M_h._M_single_bucket);
          }
          if (local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (func_1 != (Function *)
                        removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start) {
            local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&scanner.numParams;
            std::
            _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                      ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_68.
                          super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,&local_90,&local_68);
          }
          if (func_1 != (Function *)0x0) {
            operator_delete(func_1,(long)removedIndexes.
                                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)func_1);
          }
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)&allCalls);
  }
  if (changed._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    puVar21 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 *)&(local_38._M_head_impl)->neededDynlibs)->
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                *)&(local_38._M_head_impl)->neededDynlibs)->
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar21 != puVar1) {
      do {
        SVar26 = HeapType::getSignature
                           (&((puVar21->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
        if (SVar26.results.id.id != 0) {
          _Var5._M_head_impl =
               (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          func_1 = *(Function **)&(_Var5._M_head_impl)->super_Importable;
          removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)((long)&(_Var5._M_head_impl)->super_Importable + 8);
          pmVar10 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_120,(key_type *)&func_1);
          if ((((((pmVar10->hasUnseenCalls)._M_base._M_i & 1U) == 0) &&
               (pmVar10 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)local_120,(key_type *)&func_1),
               pmVar10->hasTailCalls == false)) &&
              (sVar15 = std::
                        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)local_170,(key_type *)&func_1), sVar15 == 0)) &&
             ((iVar16 = std::
                        _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                        ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                                *)&infoMap._M_h._M_single_bucket,(key_type *)&func_1),
              iVar16._M_node != (_Base_ptr)&allCalls &&
              (p_Var13 = iVar16._M_node[1]._M_right,
              _Var17 = std::
                       __find_if<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,__gnu_cxx::__ops::_Iter_negate<wasm::DAE::iteration(wasm::Module*)::_lambda(wasm::Call*)_1_>>
                                 (iVar16._M_node[1]._M_left,p_Var13,local_40),
              (_Base_ptr)_Var17._M_current == p_Var13)))) {
            removeReturnValue(local_40,(puVar21->_M_t).
                                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                              (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                              &iVar16._M_node[1]._M_left,(Module *)local_38._M_head_impl);
            local_a8.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(puVar21->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            local_68.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&scanner.numParams;
            std::
            _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                      ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_68.
                          super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,&local_a8,&local_68);
          }
        }
        puVar21 = puVar21 + 1;
      } while (puVar21 != puVar1);
    }
  }
  if ((local_40->optimize == true) &&
     (changed._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
    OptUtils::optimizeAfterInlining
              ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *)&scanner.numParams,(Module *)local_38._M_head_impl,(local_40->super_Pass).runner);
  }
  _Var7._M_nxt = changed._M_h._M_before_begin._M_nxt;
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&scanner.numParams);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_170);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               *)&infoMap._M_h._M_single_bucket);
  pCVar8 = local_48;
  if (scanner.
      super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
      super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
      super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9]
      .currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                    .super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                    super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.
                    fixed._M_elems[9].currp,
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.fixed._M_elems[9].currp);
  }
  local_3d0 = (undefined1  [8])&PTR__Pass_00d87048;
  if (scanner.
      super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
      super_Pass.runner !=
      (PassRunner *)
      &scanner.
       super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
       .super_Pass.name._M_string_length) {
    operator_delete(scanner.
                    super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                    .super_Pass.runner,
                    CONCAT71(scanner.
                             super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                             .super_Pass.name._M_string_length._1_7_,
                             (undefined1)
                             scanner.
                             super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                             .super_Pass.name._M_string_length) + 1);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_120);
  return (bool)(_Var7._M_nxt != (_Hash_node_base *)0x0 | (byte)pCVar8 & 1);
}

Assistant:

bool iteration(Module* module) {
    allDroppedCalls.clear();

    DAEFunctionInfoMap infoMap;
    // Ensure they all exist so the parallel threads don't modify the data
    // structure.
    for (auto& func : module->functions) {
      infoMap[func->name];
    }
    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        infoMap[curr->value].hasUnseenCalls = true;
      }
    }
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    for (auto& [_, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [name, calls] : info.droppedCalls) {
        allDroppedCalls[name] = calls;
      }
    }
    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;
    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      refineArgumentTypes(func, calls, module, infoMap[name]);
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // Track which functions we changed, and optimize them later if necessary.
    std::unordered_set<Function*> changed;
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto removedIndexes = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        changed.insert(func);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (changed.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (infoMap[name].hasUnseenCalls) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        removeReturnValue(func.get(), calls, module);
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        changed.insert(func.get());
      }
    }
    if (optimize && !changed.empty()) {
      OptUtils::optimizeAfterInlining(changed, module, getPassRunner());
    }
    return !changed.empty() || refinedReturnTypes;
  }